

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void wasm::GlobalTypeRewriter::updateSignatures
               (SignatureUpdates *updates,Module *wasm,
               vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *additionalPrivateTypes)

{
  bool bVar1;
  undefined1 local_90 [8];
  SignatureRewriter rewriter;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *additionalPrivateTypes_local;
  Module *wasm_local;
  SignatureUpdates *updates_local;
  
  rewriter.updates = (SignatureUpdates *)additionalPrivateTypes;
  bVar1 = std::
          unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
          ::empty(updates);
  if (!bVar1) {
    updateSignatures(std::unordered_map<wasm::HeapType,wasm::Signature,std::hash<wasm::HeapType>,std
    ::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
    Signature>>>const&,wasm::Module&,std::vector<wasm::HeapType,std::allocator<wasm::
    HeapType>>const&)::SignatureRewriter::SignatureRewriter(wasm::Module&,std::unordered_map<wasm::
    HeapType,wasm::Signature,std::hash<wasm::HeapType>,std::equal_to<wasm::HeapType>,std::
    allocator<std::pair<wasm::HeapType_const,wasm::Signature>>>const&,std::vector<wasm::HeapType,std
    ::allocator<wasm::HeapType>_>_const__
              (local_90,wasm,updates,
               (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)rewriter.updates);
    updateSignatures::SignatureRewriter::~SignatureRewriter((SignatureRewriter *)local_90);
  }
  return;
}

Assistant:

static void
  updateSignatures(const SignatureUpdates& updates,
                   Module& wasm,
                   const std::vector<HeapType>& additionalPrivateTypes = {}) {
    if (updates.empty()) {
      return;
    }

    class SignatureRewriter : public GlobalTypeRewriter {
      const SignatureUpdates& updates;

    public:
      SignatureRewriter(Module& wasm,
                        const SignatureUpdates& updates,
                        const std::vector<HeapType>& additionalPrivateTypes)
        : GlobalTypeRewriter(wasm), updates(updates) {
        update(additionalPrivateTypes);
      }

      void modifySignature(HeapType oldSignatureType, Signature& sig) override {
        auto iter = updates.find(oldSignatureType);
        if (iter != updates.end()) {
          sig.params = getTempType(iter->second.params);
          sig.results = getTempType(iter->second.results);
        }
      }
    } rewriter(wasm, updates, additionalPrivateTypes);
  }